

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O1

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::_q_updateSortCache(QGraphicsSceneBspTreeIndexPrivate *this)

{
  qreal *pqVar1;
  QGraphicsItem **ppQVar2;
  long lVar3;
  double dVar4;
  long *plVar5;
  QGraphicsItem *pQVar6;
  QGraphicsItemPrivate *pQVar7;
  QGraphicsItemPrivate *pQVar8;
  iterator __first;
  iterator __last;
  ulong uVar9;
  QGraphicsItem **ppQVar10;
  iterator iVar11;
  uint uVar12;
  QGraphicsItem **ppQVar13;
  value_type __val_2;
  iterator __i;
  QGraphicsItem **ppQVar14;
  long lVar15;
  iterator iVar16;
  long lVar17;
  size_t __n;
  value_type __val;
  undefined1 *puVar18;
  long in_FS_OFFSET;
  bool bVar19;
  int stackingOrder;
  QArrayData *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QList<QGraphicsItem_*> local_68;
  int local_44;
  QGraphicsItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar5 = *(long **)&(this->super_QGraphicsSceneIndexPrivate).field_0x8;
  _q_updateIndex(this);
  if ((this->sortCacheEnabled == true) && (this->updatingSortCache == true)) {
    this->updatingSortCache = false;
    local_44 = 0;
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (QGraphicsItem **)0x0;
    local_68.d.size = 0;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*plVar5 + 0x60))(&local_88,plVar5,1);
    if (local_78 != (undefined1 *)0x0) {
      puVar18 = (undefined1 *)0x0;
      do {
        pQVar6 = *(QGraphicsItem **)(puStack_80 + (long)puVar18 * 8);
        if ((pQVar6 != (QGraphicsItem *)0x0) &&
           (((pQVar6->d_ptr).d)->parent == (QGraphicsItem *)0x0)) {
          local_40 = pQVar6;
          QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                    ((QPodArrayOps<QGraphicsItem*> *)&local_68,local_68.d.size,&local_40);
          QList<QGraphicsItem_*>::end(&local_68);
        }
        puVar18 = puVar18 + 1;
      } while (puVar18 < local_78);
    }
    __first = QList<QGraphicsItem_*>::begin(&local_68);
    __last = QList<QGraphicsItem_*>::end(&local_68);
    if (__first.i != __last.i) {
      uVar9 = (long)__last.i - (long)__first.i >> 3;
      lVar17 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar17 == 0; lVar17 = lVar17 + -1) {
        }
      }
      std::
      __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                (__first,__last,(ulong)(((uint)lVar17 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x6340a9);
      ppQVar14 = __first.i + 1;
      iVar11 = __first;
      if ((long)__last.i - (long)__first.i < 0x81) {
        for (; ppQVar14 != __last.i; ppQVar14 = ppQVar14 + 1) {
          pQVar6 = *ppQVar14;
          pQVar7 = (pQVar6->d_ptr).d;
          pQVar8 = ((*__first.i)->d_ptr).d;
          uVar9 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
          uVar12 = (uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1;
          if (uVar12 == (uint)(uVar9 >> 0x28)) {
            dVar4 = pQVar7->z;
            pqVar1 = &pQVar8->z;
            if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
              bVar19 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
            }
            else {
              bVar19 = pQVar8->siblingIndex < pQVar7->siblingIndex;
            }
          }
          else {
            bVar19 = uVar9 != 0;
          }
          if (bVar19) {
            lVar17 = (long)ppQVar14 - (long)__first.i >> 3;
            iVar16 = __first;
            if (0 < lVar17) {
              lVar15 = 1;
              do {
                iVar11.i[lVar15] = iVar11.i[lVar15 + -1];
                lVar3 = lVar17 + lVar15;
                lVar15 = lVar15 + -1;
              } while (1 < lVar3 + -1);
            }
          }
          else {
            pQVar8 = ((*iVar11.i)->d_ptr).d;
            uVar9 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
            if (uVar12 == (uint)(uVar9 >> 0x28)) {
              dVar4 = pQVar7->z;
              pqVar1 = &pQVar8->z;
              if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                bVar19 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
              }
              else {
                bVar19 = pQVar8->siblingIndex < pQVar7->siblingIndex;
              }
            }
            else {
              bVar19 = uVar9 != 0;
            }
            iVar16.i = ppQVar14;
            ppQVar13 = ppQVar14;
            if (bVar19) {
              do {
                *ppQVar13 = ppQVar13[-1];
                pQVar7 = (pQVar6->d_ptr).d;
                pQVar8 = (ppQVar13[-2]->d_ptr).d;
                uVar9 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
                if (((uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1) ==
                    (uint)(uVar9 >> 0x28)) {
                  dVar4 = pQVar7->z;
                  pqVar1 = &pQVar8->z;
                  if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                    bVar19 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                  }
                  else {
                    bVar19 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                  }
                }
                else {
                  bVar19 = uVar9 != 0;
                }
                iVar16.i = ppQVar13 + -1;
                ppQVar13 = ppQVar13 + -1;
              } while (bVar19);
            }
          }
          *iVar16.i = pQVar6;
          iVar11.i = iVar11.i + 1;
        }
      }
      else {
        __n = 8;
        ppQVar13 = ppQVar14;
        do {
          pQVar6 = *(QGraphicsItem **)((long)__first.i + __n);
          pQVar7 = (pQVar6->d_ptr).d;
          pQVar8 = ((*__first.i)->d_ptr).d;
          uVar9 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
          uVar12 = (uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1;
          if (uVar12 == (uint)(uVar9 >> 0x28)) {
            dVar4 = pQVar7->z;
            pqVar1 = &pQVar8->z;
            if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
              bVar19 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
            }
            else {
              bVar19 = pQVar8->siblingIndex < pQVar7->siblingIndex;
            }
          }
          else {
            bVar19 = uVar9 != 0;
          }
          ppQVar2 = __first.i + __n;
          if (bVar19) {
            memmove(ppQVar14,__first.i,__n);
            iVar11 = __first;
          }
          else {
            pQVar8 = ((*iVar11.i)->d_ptr).d;
            uVar9 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
            if (uVar12 == (uint)(uVar9 >> 0x28)) {
              dVar4 = pQVar7->z;
              pqVar1 = &pQVar8->z;
              if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                bVar19 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
              }
              else {
                bVar19 = pQVar8->siblingIndex < pQVar7->siblingIndex;
              }
            }
            else {
              bVar19 = uVar9 != 0;
            }
            iVar11.i = ppQVar2;
            ppQVar10 = ppQVar13;
            if (bVar19) {
              do {
                *ppQVar10 = ppQVar10[-1];
                pQVar7 = (pQVar6->d_ptr).d;
                pQVar8 = (ppQVar10[-2]->d_ptr).d;
                uVar9 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
                if (((uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1) ==
                    (uint)(uVar9 >> 0x28)) {
                  dVar4 = pQVar7->z;
                  pqVar1 = &pQVar8->z;
                  if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                    bVar19 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                  }
                  else {
                    bVar19 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                  }
                }
                else {
                  bVar19 = uVar9 != 0;
                }
                iVar11.i = ppQVar10 + -1;
                ppQVar10 = iVar11.i;
              } while (bVar19);
            }
          }
          *iVar11.i = pQVar6;
          __n = __n + 8;
          ppQVar13 = ppQVar13 + 1;
          iVar11.i = ppQVar2;
        } while (__n != 0x80);
        for (ppQVar14 = __first.i + 0x10; ppQVar14 != __last.i; ppQVar14 = ppQVar14 + 1) {
          pQVar6 = *ppQVar14;
          pQVar7 = (pQVar6->d_ptr).d;
          pQVar8 = (ppQVar14[-1]->d_ptr).d;
          uVar9 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
          if (((uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1) ==
              (uint)(uVar9 >> 0x28)) {
            dVar4 = pQVar7->z;
            pqVar1 = &pQVar8->z;
            if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
              bVar19 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
            }
            else {
              bVar19 = pQVar8->siblingIndex < pQVar7->siblingIndex;
            }
          }
          else {
            bVar19 = uVar9 != 0;
          }
          ppQVar13 = ppQVar14;
          if (bVar19) {
            do {
              *ppQVar13 = ppQVar13[-1];
              pQVar7 = (pQVar6->d_ptr).d;
              pQVar8 = (ppQVar13[-2]->d_ptr).d;
              uVar9 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
              if (((uint)((ulong)*(undefined8 *)&pQVar7->field_0x160 >> 0x28) & 1) ==
                  (uint)(uVar9 >> 0x28)) {
                dVar4 = pQVar7->z;
                pqVar1 = &pQVar8->z;
                if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                  bVar19 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                }
                else {
                  bVar19 = pQVar8->siblingIndex < pQVar7->siblingIndex;
                }
              }
              else {
                bVar19 = uVar9 != 0;
              }
              ppQVar13 = ppQVar13 + -1;
            } while (bVar19);
          }
          *ppQVar13 = pQVar6;
        }
      }
    }
    if (local_68.d.size != 0) {
      uVar9 = 0;
      do {
        climbTree(local_68.d.ptr[uVar9],&local_44);
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)local_68.d.size);
    }
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,8,0x10);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::_q_updateSortCache()
{
    Q_Q(QGraphicsSceneBspTreeIndex);
    _q_updateIndex();

    if (!sortCacheEnabled || !updatingSortCache)
        return;

    updatingSortCache = false;
    int stackingOrder = 0;

    QList<QGraphicsItem *> topLevels;
    const QList<QGraphicsItem *> items = q->items();
    for (int i = 0; i < items.size(); ++i) {
        QGraphicsItem *item = items.at(i);
        if (item && !item->d_ptr->parent)
            topLevels << item;
    }

    std::sort(topLevels.begin(), topLevels.end(), qt_closestLeaf);
    for (int i = 0; i < topLevels.size(); ++i)
        climbTree(topLevels.at(i), &stackingOrder);
}